

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

uint __thiscall IR::Instr::GetArgOutSize(Instr *this,bool getInterpreterArgOutCount)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  uint lhs;
  undefined4 *puVar4;
  JITTimeFunctionBody *this_00;
  OpCode opcode;
  bool getInterpreterArgOutCount_local;
  Instr *this_local;
  
  OVar1 = this->m_opcode;
  if (((((OVar1 != StartCall) && (OVar1 != InlineeEnd)) && (OVar1 != InlineBuiltInEnd)) &&
      ((OVar1 != InlineNonTrackingBuiltInEnd && (OVar1 != EndCallForPolymorphicInlinee)))) &&
     (OVar1 != LoweredStartCall)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xe60,
                       "(opcode == Js::OpCode::StartCall || opcode == Js::OpCode::InlineeEnd || opcode == Js::OpCode::InlineBuiltInEnd || opcode == Js::OpCode::InlineNonTrackingBuiltInEnd || opcode == Js::OpCode::EndCallForPolymorphicInlinee || opcode == Js::OpCode::LoweredStartCall)"
                       ,
                       "opcode == Js::OpCode::StartCall || opcode == Js::OpCode::InlineeEnd || opcode == Js::OpCode::InlineBuiltInEnd || opcode == Js::OpCode::InlineNonTrackingBuiltInEnd || opcode == Js::OpCode::EndCallForPolymorphicInlinee || opcode == Js::OpCode::LoweredStartCall"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((getInterpreterArgOutCount) && (OVar1 != StartCall)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xe62,"(!getInterpreterArgOutCount || opcode == Js::OpCode::StartCall)",
                       "!getInterpreterArgOutCount || opcode == Js::OpCode::StartCall");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = Func::GetJITFunctionBody(this->m_func);
  bVar3 = JITTimeFunctionBody::IsAsmJsMode(this_00);
  if (bVar3) {
    this_local._4_4_ = GetAsmJsArgOutSize(this);
  }
  else {
    lhs = GetArgOutCount(this,getInterpreterArgOutCount);
    this_local._4_4_ = UInt32Math::Mul<8u>(lhs);
  }
  return this_local._4_4_;
}

Assistant:

uint Instr::GetArgOutSize(bool getInterpreterArgOutCount)
{
    Js::OpCode opcode = this->m_opcode;
    Assert(opcode == Js::OpCode::StartCall ||
        opcode == Js::OpCode::InlineeEnd || opcode == Js::OpCode::InlineBuiltInEnd || opcode == Js::OpCode::InlineNonTrackingBuiltInEnd ||
        opcode == Js::OpCode::EndCallForPolymorphicInlinee || opcode == Js::OpCode::LoweredStartCall);

    Assert(!getInterpreterArgOutCount || opcode == Js::OpCode::StartCall);
    if (m_func->GetJITFunctionBody()->IsAsmJsMode())
    {
        return GetAsmJsArgOutSize();
    }
    return UInt32Math::Mul<MachPtr>(GetArgOutCount(getInterpreterArgOutCount));
}